

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O2

void handle_inform_queue(list<InformItem_*,_std::allocator<InformItem_*>_> *informList)

{
  long lVar1;
  _List_node_base *p_Var2;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  p_Var2 = (_List_node_base *)informList;
  while (p_Var2 = (((_List_base<InformItem_*,_std::allocator<InformItem_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)informList) {
    lVar1 = (long)p_Var2[1]._M_next;
    if ((((*(char *)(lVar1 + 0x18) == '\0') &&
         (*(ulong *)(lVar1 + 0x10) < (ulong)-*(long *)(lVar1 + 0x30))) &&
        (*(undefined1 *)(lVar1 + 0x40) = 1, *(int *)(lVar1 + 8) != 0)) &&
       (*(SNMPTrap **)(lVar1 + 0x38) != (SNMPTrap *)0x0)) {
      SNMPTrap::sendTo(*(SNMPTrap **)(lVar1 + 0x38),(IPAddress *)(lVar1 + 0x20),true);
      *(undefined8 *)(lVar1 + 0x30) = 0;
      *(undefined1 *)(lVar1 + 0x40) = 0;
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + -1;
    }
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:98:41)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(InformItem_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/0neblock[P]Arduino_SNMP/src/SNMPInform.cpp:98:41)>
             ::_M_manager;
  remove_inform_from_list(informList,(function<bool_(InformItem_*)> *)&local_48);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void handle_inform_queue(std::list<struct InformItem *> &informList) {
    auto thisLoop = millis();
    for(auto informItem : informList){
        if(!informItem->received && thisLoop - informItem->lastSent > informItem->delay_ms){
            SNMP_LOGD("Missed Inform receive\n");
            // check if sending again
            informItem->missed = true;
            if(!informItem->retries){
                SNMP_LOGD("No more retries for inform: %lu, removing\n", informItem->requestID);
                continue;
            }
            if(informItem->trap){
                SNMP_LOGD("No response received in %lums, Resending Inform: %lu\n", thisLoop - informItem->lastSent, informItem->requestID);
                informItem->trap->sendTo(informItem->ip, true);
                informItem->lastSent = thisLoop;
                informItem->missed = false;
                informItem->retries--;
            }
        }
    }
    remove_inform_from_list(informList, [](struct InformItem* informItem) -> bool {
        return informItem->received || (informItem->retries == 0 && informItem->missed);
    });
}